

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O0

int __thiscall
iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::AddTestSuiteInstantiation
          (ParamTestSuiteInfo<PairwiseTest2> *this,string *name,pfnCreateGeneratorFunc create_func,
          pfnParamNameGeneratorFunc paramname_func,char *file,int line)

{
  Functor local_58;
  int local_34;
  char *pcStack_30;
  int line_local;
  char *file_local;
  pfnParamNameGeneratorFunc paramname_func_local;
  pfnCreateGeneratorFunc create_func_local;
  string *name_local;
  ParamTestSuiteInfo<PairwiseTest2> *this_local;
  
  local_34 = line;
  pcStack_30 = file;
  file_local = (char *)paramname_func;
  paramname_func_local = (pfnParamNameGeneratorFunc)create_func;
  create_func_local = (pfnCreateGeneratorFunc)name;
  name_local = (string *)this;
  Functor::Functor(&local_58,create_func,paramname_func,file,line);
  std::
  vector<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::Functor>,std::allocator<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::Functor>>>
  ::emplace_back<std::__cxx11::string&,iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::Functor>
            ((vector<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::Functor>,std::allocator<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest2>::Functor>>>
              *)&this->m_instantiation,name,&local_58);
  return 0;
}

Assistant:

int AddTestSuiteInstantiation(::std::string name
        , pfnCreateGeneratorFunc create_func, pfnParamNameGeneratorFunc paramname_func
        , const char* file, int line)
    {
#if IUTEST_HAS_STD_EMPLACE
        m_instantiation.emplace_back(name, Functor(create_func, paramname_func, file, line));
#else
        m_instantiation.push_back(InstantiationPair(name, Functor(create_func, paramname_func, file, line)));
#endif
        return 0;
    }